

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

string * __thiscall
tinyformat::format<int,int,bool,long>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,int *args,int *args_1,
          bool *args_2,long *args_3)

{
  long in_FS_OFFSET;
  ostringstream oss;
  undefined1 local_220 [376];
  FormatArg *local_a8;
  undefined4 local_a0;
  FormatArg local_98;
  int *local_80;
  code *local_78;
  code *local_70;
  int *local_68;
  code *local_60;
  code *local_58;
  bool *local_50;
  code *local_48;
  code *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
  local_a8 = &local_98;
  local_a0 = 4;
  local_98.m_formatImpl = detail::FormatArg::formatImpl<int>;
  local_98.m_toIntImpl = detail::FormatArg::toIntImpl<int>;
  local_78 = detail::FormatArg::formatImpl<int>;
  local_70 = detail::FormatArg::toIntImpl<int>;
  local_60 = detail::FormatArg::formatImpl<bool>;
  local_58 = detail::FormatArg::toIntImpl<bool>;
  local_48 = detail::FormatArg::formatImpl<long>;
  local_40 = detail::FormatArg::toIntImpl<long>;
  local_98.m_value = fmt;
  local_80 = args;
  local_68 = args_1;
  local_50 = args_2;
  detail::formatImpl((ostream *)local_220,(char *)this,local_a8,4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
  std::ios_base::~ios_base((ios_base *)(local_220 + 0x70));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}